

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_channel_push_snapshot
               (cali_id_t chn_id,int param_2,int n,cali_id_t *trigger_info_attr_list,
               cali_variant_t *trigger_info_val_list)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  Attribute AVar4;
  ulong uVar5;
  size_t n_00;
  SnapshotView trigger_info_00;
  Channel channel;
  Caliper c;
  Attribute attr [64];
  Variant data [64];
  FixedSizeSnapshotRecord<64UL> trigger_info;
  
  cali::Caliper::Caliper(&c);
  uVar5 = 0;
  memset(attr,0,0x200);
  memset(data,0,0x400);
  if (n < 1) {
    n = 0;
  }
  n_00 = 0x40;
  if (n < 0x40) {
    n_00 = (size_t)(uint)n;
  }
  for (; (uint)((int)n_00 << 3) != uVar5; uVar5 = uVar5 + 8) {
    AVar4 = cali::Caliper::get_attribute(&c,*(cali_id_t *)((long)trigger_info_attr_list + uVar5));
    *(Node **)((long)&attr[0].m_node + uVar5) = AVar4.m_node;
    puVar1 = (undefined8 *)((long)&trigger_info_val_list->type_and_size + uVar5 * 2);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)&data[0].m_v.type_and_size + uVar5 * 2) = *puVar1;
    *(undefined8 *)((long)&data[0].m_v.value + uVar5 * 2) = uVar2;
  }
  memset(&trigger_info,0,0x600);
  trigger_info.m_builder.m_capacity = 0x40;
  trigger_info.m_builder.m_len = 0;
  trigger_info.m_builder.m_skipped = 0;
  trigger_info.m_builder.m_data = trigger_info.m_data;
  cali::Caliper::make_record(&c,n_00,attr,data,&trigger_info.m_builder,(Node *)0x0);
  cali::Caliper::get_channel((Caliper *)&channel,(cali_id_t)&c);
  if ((channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (0 < (channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count)) {
    bVar3 = cali::Channel::is_active(&channel);
    if (bVar3) {
      trigger_info_00.m_len = trigger_info.m_builder.m_len;
      trigger_info_00.m_data = trigger_info.m_builder.m_data;
      cali::Caliper::push_snapshot
                (&c,channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,trigger_info_00);
    }
  }
  cali::Channel::~Channel(&channel);
  return;
}

Assistant:

void cali_channel_push_snapshot(
    cali_id_t chn_id,
    int /*scope*/,
    int                  n,
    const cali_id_t      trigger_info_attr_list[],
    const cali_variant_t trigger_info_val_list[]
)
{
    Caliper c;

    Attribute attr[64];
    Variant   data[64];

    n = std::min(std::max(n, 0), 64);

    for (int i = 0; i < n; ++i) {
        attr[i] = c.get_attribute(trigger_info_attr_list[i]);
        data[i] = Variant(trigger_info_val_list[i]);
    }

    FixedSizeSnapshotRecord<64> trigger_info;
    c.make_record(n, attr, data, trigger_info.builder());

    Channel channel = c.get_channel(chn_id);

    if (channel && channel.is_active())
        c.push_snapshot(channel.body(), trigger_info.view());
}